

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.h
# Opt level: O2

mat4 * __thiscall Camera::GetViewMatrix(mat4 *__return_storage_ptr__,Camera *this)

{
  vec<3,_float,_(glm::qualifier)0> *in_R8;
  vec<3,_float,_(glm::qualifier)0> local_20;
  
  local_20 = glm::operator+(&this->Position,&this->Front);
  glm::lookAtRH<float,(glm::qualifier)0>
            (__return_storage_ptr__,(glm *)this,&local_20,&this->Up,in_R8);
  return __return_storage_ptr__;
}

Assistant:

glm::mat4 GetViewMatrix() const {
        return glm::lookAt(this->Position, this->Position + this->Front, this->Up);
    }